

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

void Diligent::PipelineStateVkImpl::RemapOrVerifyShaderResources
               (TShaderStages *ShaderStages,
               RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignatures,
               Uint32 SignatureCount,TBindIndexToDescSetIndex *BindIndexToDescSetIndex,
               bool bVerifyOnly,bool bStripReflection,char *PipelineName,
               TShaderResources *pDvpShaderResources,TResourceAttibutions *pDvpResourceAttibutions)

{
  pointer *ppRVar1;
  PipelineResourceSignatureDesc *Args_7;
  ushort uVar2;
  SHADER_TYPE SVar3;
  uint uVar4;
  element_type *peVar5;
  pointer puVar6;
  iterator __position;
  pointer puVar7;
  PipelineResourceSignatureImplType *pPVar8;
  SHADER_RESOURCE_TYPE ResourceType;
  PIPELINE_RESOURCE_FLAGS ResourceFlags;
  pointer pSVar9;
  shared_ptr<const_Diligent::SPIRVShaderResources> *__args;
  SPIRVShaderResourceAttribs *Args_3;
  PipelineResourceDesc *ResDesc;
  PipelineResourceAttribsType *pPVar10;
  ImmutableSamplerAttribsType *pIVar11;
  char (*Args_1) [32];
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *Args_1_00;
  Uint32 UVar12;
  char (*pacVar13) [32];
  Uint32 n;
  undefined7 in_register_00000089;
  ShaderDesc *Args_1_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV;
  pointer pSVar14;
  Uint32 UVar15;
  uint uVar16;
  ulong uVar17;
  char local_e9;
  string msg;
  Uint32 ResourceBinding;
  ShaderDesc *local_c0;
  ResourceAttribution ResAttribution;
  Uint32 SpvDescrSet;
  uint local_84;
  ShaderVkImpl *local_80;
  TShaderStages *local_78;
  ulong local_70;
  pointer local_68;
  shared_ptr<const_Diligent::SPIRVShaderResources> *local_60;
  ulong local_58;
  TBindIndexToDescSetIndex *local_50;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *local_48;
  SPIRVShaderResources *local_40;
  char *local_38;
  
  Args_1_01 = (ShaderDesc *)CONCAT71(in_register_00000089,bStripReflection);
  local_38 = "<null>";
  if (PipelineName != (char *)0x0) {
    local_38 = PipelineName;
  }
  pSVar9 = (ShaderStages->
           super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ShaderStages->
      super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar9) {
    local_70 = 0;
    local_78 = ShaderStages;
    local_50 = BindIndexToDescSetIndex;
    local_48 = pSignatures;
    do {
      pSVar14 = pSVar9 + local_70;
      SVar3 = pSVar9[local_70].Type;
      pacVar13 = (char (*) [32])
                 pSVar9[local_70].Shaders.
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      Args_1 = (char (*) [32])
               pSVar9[local_70].Shaders.
               super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pacVar13 - (long)Args_1 >> 3 !=
          ((long)pSVar9[local_70].SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)pSVar9[local_70].SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        FormatString<char[26],char[32]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"RemapOrVerifyShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x2a5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        Args_1 = (char (*) [32])
                 (pSVar14->Shaders).
                 super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pacVar13 = (char (*) [32])
                   (pSVar14->Shaders).
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pacVar13 != Args_1) {
        uVar17 = 0;
        local_68 = pSVar14;
        do {
          local_80 = *(ShaderVkImpl **)(*Args_1 + uVar17 * 8);
          SrcSPIRV = (pSVar14->SPIRVs).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17;
          __args = ShaderVkImpl::GetShaderResources(local_80);
          if ((__args->
              super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr == (element_type *)0x0) {
            FormatString<char[26],char[17]>
                      (&msg,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"pShaderResources",(char (*) [17])Args_1);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"RemapOrVerifyShaderResources",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x2ad);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_58 = uVar17;
          if (pDvpShaderResources != (TShaderResources *)0x0) {
            std::
            vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
            ::emplace_back<std::shared_ptr<Diligent::SPIRVShaderResources_const>const&>
                      ((vector<std::shared_ptr<Diligent::SPIRVShaderResources_const>,std::allocator<std::shared_ptr<Diligent::SPIRVShaderResources_const>>>
                        *)pDvpShaderResources,__args);
          }
          peVar5 = (__args->
                   super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          uVar2 = peVar5->m_TotalResources;
          UVar12 = (Uint32)uVar2;
          local_60 = __args;
          if (uVar2 != 0) {
            local_c0 = &(local_80->super_ShaderBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                        .m_Desc;
            n = 0;
            local_40 = peVar5;
            do {
              Args_3 = SPIRVShaderResources::GetResAttribs(local_40,n,UVar12,0);
              Args_1_00 = local_48;
              PipelineStateBase<Diligent::EngineVkImplTraits>::
              GetResourceAttribution<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
                        (&ResAttribution,
                         (PipelineStateBase<Diligent::EngineVkImplTraits> *)Args_3->Name,
                         (char *)(ulong)SVar3,(SHADER_TYPE)local_48,
                         (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                         (ulong)SignatureCount,(Uint32)Args_1_01);
              if ((ResAttribution.SignatureIndex == 0xffffffff) ||
                 ((ResAttribution.ResourceIndex == 0xffffffff &&
                  (ResAttribution.ImmutableSamplerIndex == 0xffffffff)))) {
                Args_1_00 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2ba;
                Args_1_01 = local_c0;
                LogError<true,char[9],char_const*,char[22],char_const*,char[89],char_const*,char[3]>
                          (false,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                           ,0x2ba,(char (*) [9])"Shader \'",(char **)local_c0,
                           (char (*) [22])"\' contains resource \'",&Args_3->Name,
                           (char (*) [89])
                           "\' that is not present in any pipeline resource signature used to create pipeline state \'"
                           ,&local_38,(char (*) [3])"\'.");
              }
              pPVar8 = ResAttribution.pSignature;
              Args_7 = &((ResAttribution.pSignature)->
                        super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                        .m_Desc;
              ResourceType = SPIRVShaderResourceAttribs::GetShaderResourceType(Args_3->Type);
              ResourceFlags = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(Args_3->Type);
              ResourceBinding = 0xffffffff;
              if (ResAttribution.ResourceIndex == 0xffffffff) {
                if (ResAttribution.ImmutableSamplerIndex != 0xffffffff) {
                  if (ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
                    msg._M_dataplus._M_p = GetShaderResourceTypeLiteralName(ResourceType,false);
                    Args_1_00 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2d4;
                    Args_1_01 = local_c0;
                    LogError<true,char[9],char_const*,char[32],char_const*,char[13],char_const*,char[89],char_const*,char[3]>
                              (false,"operator()",
                               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                               ,0x2d4,(char (*) [9])"Shader \'",(char **)local_c0,
                               (char (*) [32])"\' contains resource with name \'",&Args_3->Name,
                               (char (*) [13])"\' and type \'",(char **)&msg,
                               (char (*) [89])
                               "\' that is not compatible with immutable sampler defined in pipeline resource signature \'"
                               ,(char **)Args_7,(char (*) [3])"\'.");
                  }
                  pIVar11 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                            GetImmutableSamplerAttribs
                                      (&(ResAttribution.pSignature)->
                                        super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                       ,ResAttribution.ImmutableSamplerIndex);
                  UVar12 = pIVar11->BindingIndex;
                  UVar15 = pIVar11->DescrSet;
                  goto LAB_001eb66a;
                }
                FormatString<char[59]>
                          (&msg,(char (*) [59])
                                "Either immutable sampler or resource index should be valid");
                Args_1_00 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x2dc;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                           ,0x2dc);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
                UVar12 = 0xffffffff;
                UVar15 = 0xffffffff;
LAB_001eb6d2:
                FormatString<char[26],char[47]>
                          (&msg,(Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"ResourceBinding != ~0u && DescriptorSet != ~0u",
                           (char (*) [47])Args_1_00);
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"operator()",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                           ,0x2df);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                ResDesc = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                          GetResourceDesc(&(ResAttribution.pSignature)->
                                           super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                          ,ResAttribution.ResourceIndex);
                Args_1_00 = (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
                            (ulong)Args_3->ArraySize;
                Args_1_01 = (ShaderDesc *)(Args_7->super_DeviceObjectAttribs).Name;
                ValidatePipelineResourceCompatibility
                          (ResDesc,ResourceType,ResourceFlags,(uint)Args_3->ArraySize,
                           (local_c0->super_DeviceObjectAttribs).Name,(char *)Args_1_01);
                pPVar10 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::
                          GetResourceAttribs(&(ResAttribution.pSignature)->
                                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                                             ,ResAttribution.ResourceIndex);
                UVar12 = (uint)*(undefined8 *)pPVar10 & 0xffff;
                UVar15 = (uint)((ulong)*(undefined8 *)pPVar10 >> 0x3e) & 1;
LAB_001eb66a:
                ResourceBinding = UVar12;
                if ((UVar12 == 0xffffffff) || (UVar15 == 0xffffffff)) goto LAB_001eb6d2;
              }
              uVar16 = UVar15 + local_50->_M_elems
                                [(pPVar8->
                                 super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 .m_Desc.BindingIndex];
              local_84 = uVar16;
              if (bVerifyOnly) {
                puVar6 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
                UVar15 = puVar6[Args_3->BindingDecorationOffset];
                msg._M_dataplus._M_p._0_4_ = UVar15;
                uVar4 = puVar6[Args_3->DescriptorSetDecorationOffset];
                SpvDescrSet = uVar4;
                if (UVar15 != UVar12) {
                  local_e9 = '.';
                  Args_1_01 = local_c0;
                  LogError<true,char[9],char_const*,char[18],char_const*,char[14],unsigned_int,char[57],char_const*,char[24],unsigned_int,char>
                            (false,"operator()",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                             ,0x2e9,(char (*) [9])"Shader \'",(char **)local_c0,
                             (char (*) [18])"\' maps resource \'",&Args_3->Name,
                             (char (*) [14])"\' to binding ",(uint *)&msg,
                             (char (*) [57])
                             ", but the same resource in pipeline resource signature \'",
                             (char **)Args_7,(char (*) [24])"\' is mapped to binding ",
                             &ResourceBinding,&local_e9);
                }
                if (uVar4 != uVar16) {
                  local_e9 = '.';
                  Args_1_01 = local_c0;
                  LogError<true,char[9],char_const*,char[18],char_const*,char[21],unsigned_int,char[57],char_const*,char[20],unsigned_int,char>
                            (false,"operator()",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                             ,0x2ef,(char (*) [9])"Shader \'",(char **)local_c0,
                             (char (*) [18])"\' maps resource \'",&Args_3->Name,
                             (char (*) [21])"\' to descriptor set ",&SpvDescrSet,
                             (char (*) [57])
                             ", but the same resource in pipeline resource signature \'",
                             (char **)Args_7,(char (*) [20])"\' is mapped to set ",&local_84,
                             &local_e9);
                }
              }
              else {
                puVar6 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar6[Args_3->BindingDecorationOffset] = UVar12;
                puVar6[Args_3->DescriptorSetDecorationOffset] = uVar16;
              }
              if (pDvpResourceAttibutions != (TResourceAttibutions *)0x0) {
                __position._M_current =
                     (pDvpResourceAttibutions->
                     super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pDvpResourceAttibutions->
                    super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>>
                  ::
                  _M_realloc_insert<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution_const&>
                            ((vector<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>>
                              *)pDvpResourceAttibutions,__position,&ResAttribution);
                }
                else {
                  *(ulong *)&(__position._M_current)->ImmutableSamplerIndex =
                       CONCAT44(ResAttribution._20_4_,ResAttribution.ImmutableSamplerIndex);
                  (__position._M_current)->pSignature = ResAttribution.pSignature;
                  (__position._M_current)->SignatureIndex = ResAttribution.SignatureIndex;
                  (__position._M_current)->ResourceIndex = ResAttribution.ResourceIndex;
                  ppRVar1 = &(pDvpResourceAttibutions->
                             super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppRVar1 = *ppRVar1 + 1;
                }
              }
              n = n + 1;
              UVar12 = (Uint32)local_40->m_TotalResources;
            } while (n < UVar12);
          }
          uVar17 = local_58;
          pSVar14 = local_68;
          if (bStripReflection) {
            OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&msg,SrcSPIRV,
                          SPV_ENV_MAX,
                          ((local_60->
                           super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->m_IsHLSLSource | SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION);
            if (msg._M_dataplus._M_p == (pointer)msg._M_string_length) {
              Args_1_01 = &(local_80->super_ShaderBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                           .m_Desc;
              LogError<false,char[53],char_const*,char[51]>
                        (false,"RemapOrVerifyShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                         ,0x30c,(char (*) [53])
                                "Failed to strip reflection information from shader \'",
                         (char **)Args_1_01,
                         (char (*) [51])"\'. This may indicate a problem with the byte code.");
            }
            else {
              puVar6 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              puVar7 = (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = (pointer)msg._M_dataplus._M_p;
              (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = (pointer)msg._M_string_length;
              (SrcSPIRV->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)msg.field_2._M_allocated_capacity
              ;
              msg._M_dataplus._M_p = (pointer)0x0;
              msg._M_string_length = 0;
              msg.field_2._M_allocated_capacity = 0;
              if (puVar6 == (pointer)0x0) goto LAB_001eb98d;
              operator_delete(puVar6,(long)puVar7 - (long)puVar6);
            }
            if (msg._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(msg._M_dataplus._M_p,
                              msg.field_2._M_allocated_capacity - (long)msg._M_dataplus._M_p);
            }
          }
LAB_001eb98d:
          uVar17 = uVar17 + 1;
          Args_1 = (char (*) [32])
                   (pSVar14->Shaders).
                   super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar17 < (ulong)((long)(pSVar14->Shaders).
                                        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)Args_1 >>
                                 3));
      }
      local_70 = local_70 + 1;
      pSVar9 = (local_78->
               super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_70 <
             (ulong)(((long)(local_78->
                            super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9 >> 3) *
                    0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void PipelineStateVkImpl::RemapOrVerifyShaderResources(
    TShaderStages&                                       ShaderStages,
    const RefCntAutoPtr<PipelineResourceSignatureVkImpl> pSignatures[],
    const Uint32                                         SignatureCount,
    const TBindIndexToDescSetIndex&                      BindIndexToDescSetIndex,
    bool                                                 bVerifyOnly,
    bool                                                 bStripReflection,
    const char*                                          PipelineName,
    TShaderResources*                                    pDvpShaderResources,
    TResourceAttibutions*                                pDvpResourceAttibutions) noexcept(false)
{
    if (PipelineName == nullptr)
        PipelineName = "<null>";

    // Verify that pipeline layout is compatible with shader resources and
    // remap resource bindings.
    for (size_t s = 0; s < ShaderStages.size(); ++s)
    {
        const std::vector<const ShaderVkImpl*>& Shaders    = ShaderStages[s].Shaders;
        std::vector<std::vector<uint32_t>>&     SPIRVs     = ShaderStages[s].SPIRVs;
        const SHADER_TYPE                       ShaderType = ShaderStages[s].Type;

        VERIFY_EXPR(Shaders.size() == SPIRVs.size());

        for (size_t i = 0; i < Shaders.size(); ++i)
        {
            const ShaderVkImpl*    pShader = Shaders[i];
            std::vector<uint32_t>& SPIRV   = SPIRVs[i];

            const auto& pShaderResources = pShader->GetShaderResources();
            VERIFY_EXPR(pShaderResources);

            if (pDvpShaderResources)
                pDvpShaderResources->emplace_back(pShaderResources);

            pShaderResources->ProcessResources(
                [&](const SPIRVShaderResourceAttribs& SPIRVAttribs, Uint32) //
                {
                    const ResourceAttribution ResAttribution = GetResourceAttribution(SPIRVAttribs.Name, ShaderType, pSignatures, SignatureCount);
                    if (!ResAttribution)
                    {
                        LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource '", SPIRVAttribs.Name,
                                            "' that is not present in any pipeline resource signature used to create pipeline state '",
                                            PipelineName, "'.");
                    }

                    const PipelineResourceSignatureDesc& SignDesc = ResAttribution.pSignature->GetDesc();
                    const SHADER_RESOURCE_TYPE           ResType  = SPIRVShaderResourceAttribs::GetShaderResourceType(SPIRVAttribs.Type);
                    const PIPELINE_RESOURCE_FLAGS        Flags    = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(SPIRVAttribs.Type);

                    Uint32 ResourceBinding = ~0u;
                    Uint32 DescriptorSet   = ~0u;
                    if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        const PipelineResourceDesc& ResDesc = ResAttribution.pSignature->GetResourceDesc(ResAttribution.ResourceIndex);
                        ValidatePipelineResourceCompatibility(ResDesc, ResType, Flags, SPIRVAttribs.ArraySize,
                                                              pShader->GetDesc().Name, SignDesc.Name);

                        const PipelineResourceSignatureVkImpl::ResourceAttribs& ResAttribs{ResAttribution.pSignature->GetResourceAttribs(ResAttribution.ResourceIndex)};
                        ResourceBinding = ResAttribs.BindingIndex;
                        DescriptorSet   = ResAttribs.DescrSet;
                    }
                    else if (ResAttribution.ImmutableSamplerIndex != ResourceAttribution::InvalidResourceIndex)
                    {
                        if (ResType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' contains resource with name '", SPIRVAttribs.Name,
                                                "' and type '", GetShaderResourceTypeLiteralName(ResType),
                                                "' that is not compatible with immutable sampler defined in pipeline resource signature '",
                                                SignDesc.Name, "'.");
                        }
                        const ImmutableSamplerAttribsVk& SamAttribs{ResAttribution.pSignature->GetImmutableSamplerAttribs(ResAttribution.ImmutableSamplerIndex)};
                        ResourceBinding = SamAttribs.BindingIndex;
                        DescriptorSet   = SamAttribs.DescrSet;
                    }
                    else
                    {
                        UNEXPECTED("Either immutable sampler or resource index should be valid");
                    }

                    VERIFY_EXPR(ResourceBinding != ~0u && DescriptorSet != ~0u);
                    DescriptorSet += BindIndexToDescSetIndex[SignDesc.BindingIndex];
                    if (bVerifyOnly)
                    {
                        const Uint32 SpvBinding  = SPIRV[SPIRVAttribs.BindingDecorationOffset];
                        const Uint32 SpvDescrSet = SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset];
                        if (SpvBinding != ResourceBinding)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to binding ", SpvBinding, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to binding ", ResourceBinding, '.');
                        }
                        if (SpvDescrSet != DescriptorSet)
                        {
                            LOG_ERROR_AND_THROW("Shader '", pShader->GetDesc().Name, "' maps resource '", SPIRVAttribs.Name,
                                                "' to descriptor set ", SpvDescrSet, ", but the same resource in pipeline resource signature '",
                                                SignDesc.Name, "' is mapped to set ", DescriptorSet, '.');
                        }
                    }
                    else
                    {
                        SPIRV[SPIRVAttribs.BindingDecorationOffset]       = ResourceBinding;
                        SPIRV[SPIRVAttribs.DescriptorSetDecorationOffset] = DescriptorSet;
                    }

                    if (pDvpResourceAttibutions)
                        pDvpResourceAttibutions->emplace_back(ResAttribution);
                });

            if (bStripReflection)
            {
#if !DILIGENT_NO_HLSL
                // We have to strip reflection instructions to fix the following validation error:
                //     SPIR-V module not valid: DecorateStringGOOGLE requires one of the following extensions: SPV_GOOGLE_decorate_string
                // Optimizer also performs validation and may catch problems with the byte code.
                // NB: SPIRV offsets become INVALID after this operation.
                SPIRV_OPTIMIZATION_FLAGS OptimizationFlags = SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION;
                if (pShaderResources->IsHLSLSource())
                {
                    OptimizationFlags |= SPIRV_OPTIMIZATION_FLAG_LEGALIZATION;
                }
                std::vector<uint32_t> StrippedSPIRV = OptimizeSPIRV(SPIRV, SPV_ENV_MAX, OptimizationFlags);
                if (!StrippedSPIRV.empty())
                    SPIRV = std::move(StrippedSPIRV);
                else
                    LOG_ERROR("Failed to strip reflection information from shader '", pShader->GetDesc().Name, "'. This may indicate a problem with the byte code.");
#endif
            }
        }
    }
}